

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::peer_list::apply_port_filter
          (peer_list *this,port_filter *filter,torrent_state *state,
          vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          *banned)

{
  peer_connection_interface *ppVar1;
  uint uVar2;
  int iVar3;
  difference_type dVar4;
  size_type sVar5;
  undefined4 extraout_var;
  size_type sVar6;
  _Self *p_Var7;
  undefined1 *extraout_RDX;
  undefined1 *extraout_RDX_00;
  _Self local_c8;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  *local_a8;
  torrent_state *local_a0;
  _Self local_98;
  _Self local_78;
  iterator local_50;
  
  p_Var7 = &local_c8;
  local_c8._M_cur =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_c8._M_first =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_first;
  local_c8._M_last =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_c8._M_node =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  local_a8 = banned;
  local_a0 = state;
  do {
    while( true ) {
      if (local_c8._M_cur ==
          (this->m_peers).
          super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
          .
          super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        return;
      }
      uVar2 = port_filter::access(filter,(char *)(ulong)(*local_c8._M_cur)->port,(int)p_Var7);
      if (((uVar2 & 1) != 0) && (*local_c8._M_cur != this->m_locked_peer)) break;
      local_c8._M_cur = local_c8._M_cur + 1;
      p_Var7 = (_Self *)extraout_RDX;
      if (local_c8._M_cur == local_c8._M_last) {
        local_c8._M_cur = local_c8._M_node[1];
        local_c8._M_last = local_c8._M_cur + 0x40;
        local_c8._M_first = local_c8._M_cur;
        local_c8._M_node = local_c8._M_node + 1;
      }
    }
    local_98._M_cur =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_98._M_first =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first;
    local_98._M_last =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_98._M_node =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_node;
    dVar4 = ::std::operator-(&local_c8,&local_98);
    if ((*local_c8._M_cur)->connection == (peer_connection_interface *)0x0) {
LAB_00258868:
      local_50._M_cur = local_c8._M_cur;
      local_50._M_first = local_c8._M_first;
      local_50._M_last = local_c8._M_last;
      local_50._M_node = local_c8._M_node;
      erase_peer(this,&local_50,local_a0);
    }
    else {
      sVar5 = ::std::
              deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      *)this);
      ppVar1 = (*local_c8._M_cur)->connection;
      iVar3 = (*ppVar1->_vptr_peer_connection_interface[2])(ppVar1);
      ::std::
      vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ::push_back(local_a8,(value_type *)CONCAT44(extraout_var,iVar3));
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                ((error_code *)&local_98,banned_by_port_filter,(type *)0x0);
      (*ppVar1->_vptr_peer_connection_interface[4])(ppVar1,&local_98,1,0);
      sVar6 = ::std::
              deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      *)this);
      if ((int)sVar5 <= (int)sVar6) goto LAB_00258868;
    }
    local_78._M_cur =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_78._M_first =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first;
    local_78._M_last =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_78._M_node =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_node;
    ::std::operator+(&local_98,&local_78,(long)(int)dVar4);
    local_c8._M_last = local_98._M_last;
    local_c8._M_node = local_98._M_node;
    local_c8._M_cur = local_98._M_cur;
    local_c8._M_first = local_98._M_first;
    p_Var7 = (_Self *)extraout_RDX_00;
  } while( true );
}

Assistant:

void peer_list::apply_port_filter(port_filter const& filter
		, torrent_state* state, std::vector<tcp::endpoint>& banned)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		for (auto i = m_peers.begin(); i != m_peers.end();)
		{
			if ((filter.access((*i)->port) & port_filter::blocked) == 0)
			{
				++i;
				continue;
			}
			if (*i == m_locked_peer)
			{
				++i;
				continue;
			}

			int const current = int(i - m_peers.begin());
			TORRENT_ASSERT(current >= 0);
			TORRENT_ASSERT(m_peers.size() > 0);
			TORRENT_ASSERT(i != m_peers.end());

			if ((*i)->connection)
			{
				// disconnecting the peer here may also delete the
				// peer_info_struct. If that is the case, just continue
				int count = int(m_peers.size());
				peer_connection_interface* p = (*i)->connection;

				banned.push_back(p->remote());

				p->disconnect(errors::banned_by_port_filter, operation_t::bittorrent);
				// what *i refers to has changed, i.e. cur was deleted
				if (int(m_peers.size()) < count)
				{
					i = m_peers.begin() + current;
					continue;
				}
				TORRENT_ASSERT((*i)->connection == nullptr
					|| (*i)->connection->peer_info_struct() == nullptr);
			}

			erase_peer(i, state);
			i = m_peers.begin() + current;
		}
	}